

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

_Bool upb_Array_Insert(upb_Array *arr,size_t i,size_t count,upb_Arena *arena)

{
  ulong uVar1;
  _Bool _Var2;
  ulong min_capacity;
  
  if ((arr->data_dont_copy_me__upb_internal_use_only & 4) != 0) {
    __assert_fail("!upb_Array_IsFrozen(arr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x4d,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  if (arena == (upb_Arena *)0x0) {
    __assert_fail("arena",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x4e,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  uVar1 = arr->size_dont_copy_me__upb_internal_use_only;
  if (uVar1 < i) {
    __assert_fail("i <= arr->size_dont_copy_me__upb_internal_use_only",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                  ,0x4f,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
  }
  min_capacity = uVar1 + count;
  if (!CARRY8(uVar1,count)) {
    _Var2 = true;
    if (arr->capacity_dont_copy_me__upb_internal_use_only < min_capacity) {
      _Var2 = _upb_Array_Realloc_dont_copy_me__upb_internal_use_only(arr,min_capacity,arena);
    }
    if (_Var2 != false) {
      arr->size_dont_copy_me__upb_internal_use_only = min_capacity;
      upb_Array_Move(arr,count + i,i,uVar1 - i);
    }
    return _Var2;
  }
  __assert_fail("count + arr->size_dont_copy_me__upb_internal_use_only >= count",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/array.c"
                ,0x50,"_Bool upb_Array_Insert(upb_Array *, size_t, size_t, upb_Arena *)");
}

Assistant:

bool upb_Array_Insert(upb_Array* arr, size_t i, size_t count,
                      upb_Arena* arena) {
  UPB_ASSERT(!upb_Array_IsFrozen(arr));
  UPB_ASSERT(arena);
  UPB_ASSERT(i <= arr->UPB_PRIVATE(size));
  UPB_ASSERT(count + arr->UPB_PRIVATE(size) >= count);
  const size_t oldsize = arr->UPB_PRIVATE(size);
  if (!UPB_PRIVATE(_upb_Array_ResizeUninitialized)(
          arr, arr->UPB_PRIVATE(size) + count, arena)) {
    return false;
  }
  upb_Array_Move(arr, i + count, i, oldsize - i);
  return true;
}